

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

void __thiscall CLParserTestParseSimple::Run(CLParserTestParseSimple *this)

{
  Test *pTVar1;
  bool bVar2;
  size_type sVar3;
  reference __rhs;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined4 local_e0;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  string err;
  string output;
  CLParser parser;
  CLParserTestParseSimple *this_local;
  
  CLParser::CLParser((CLParser *)((long)&output.field_2 + 8));
  std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_80);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"foo\r\nNote: inc file prefix:  foo.h\r\nbar\r\n",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Note: inc file prefix:",&local_d9);
  bVar2 = CLParser::Parse((CLParser *)((long)&output.field_2 + 8),&local_a0,&local_d8,
                          (string *)((long)&err.field_2 + 8),(string *)local_80);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                     ,0x38,
                     "parser.Parse( \"foo\\r\\n\" \"Note: inc file prefix:  foo.h\\r\\n\" \"bar\\r\\n\", \"Note: inc file prefix:\", &output, &err)"
                    );
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pTVar1 = g_current_test;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = std::operator==("foo\nbar\n",
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&err.field_2 + 8));
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                       ,0x3a,"\"foo\\nbar\\n\" == output");
    pTVar1 = g_current_test;
    if (bVar2) {
      sVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&output.field_2 + 8));
      bVar2 = testing::Test::Check
                        (pTVar1,sVar3 == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                         ,0x3b,"1u == parser.includes_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        local_e8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&output.field_2 + 8));
        __rhs = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_e8);
        bVar2 = std::operator==("foo.h",__rhs);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                           ,0x3c,"\"foo.h\" == *parser.includes_.begin()");
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_e0 = 0;
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_e0 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_e0 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_e0 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_e0 = 1;
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  CLParser::~CLParser((CLParser *)((long)&output.field_2 + 8));
  return;
}

Assistant:

TEST(CLParserTest, ParseSimple) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo\r\n"
      "Note: inc file prefix:  foo.h\r\n"
      "bar\r\n",
      "Note: inc file prefix:", &output, &err));

  ASSERT_EQ("foo\nbar\n", output);
  ASSERT_EQ(1u, parser.includes_.size());
  ASSERT_EQ("foo.h", *parser.includes_.begin());
}